

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::BigitsShiftLeft(Bignum *this,int shift_amount)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  sVar1 = this->used_bigits_;
  lVar4 = 0;
  iVar3 = 0;
  if (0 < sVar1) {
    iVar3 = (int)sVar1;
  }
  uVar5 = 0;
  for (; iVar3 != lVar4; lVar4 = lVar4 + 1) {
    uVar2 = this->bigits_buffer_[lVar4];
    this->bigits_buffer_[lVar4] = (uVar2 << ((byte)shift_amount & 0x1f)) + uVar5 & 0xfffffff;
    uVar5 = uVar2 >> (0x1c - (byte)shift_amount & 0x1f);
  }
  if (uVar5 != 0) {
    this->bigits_buffer_[sVar1] = uVar5;
    this->used_bigits_ = sVar1 + 1;
  }
  return;
}

Assistant:

void Bignum::BigitsShiftLeft(const int shift_amount) {
  DOUBLE_CONVERSION_ASSERT(shift_amount < kBigitSize);
  DOUBLE_CONVERSION_ASSERT(shift_amount >= 0);
  Chunk carry = 0;
  for (int i = 0; i < used_bigits_; ++i) {
    const Chunk new_carry = RawBigit(i) >> (kBigitSize - shift_amount);
    RawBigit(i) = ((RawBigit(i) << shift_amount) + carry) & kBigitMask;
    carry = new_carry;
  }
  if (carry != 0) {
    RawBigit(used_bigits_) = carry;
    used_bigits_++;
  }
}